

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_test.cc
# Opt level: O1

void xLearn::read_from_memory(string *filename,int task_id)

{
  bool has_label;
  int iVar1;
  int iVar2;
  DMatrix *matrix;
  InmemReader in_mem_reader;
  InmemReader local_190;
  
  local_190.super_Reader.filename_._M_dataplus._M_p =
       (pointer)&local_190.super_Reader.filename_.field_2;
  iVar2 = 0;
  local_190.super_Reader.filename_._M_string_length = 0;
  local_190.super_Reader.filename_.field_2._M_local_buf[0] = '\0';
  local_190.super_Reader.data_samples_.pos = 0;
  local_190.super_Reader.data_samples_.hash_value_1 = 0;
  local_190.super_Reader.data_samples_.hash_value_2 = 0;
  local_190.super_Reader.data_samples_.row_length = 0;
  local_190.super_Reader.data_samples_.row.
  super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_190.super_Reader.data_samples_.row.
  super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_190.super_Reader.data_samples_.row.
  super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_190.super_Reader.data_samples_.row.
  super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_190.super_Reader.data_samples_.row.
  super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  local_190.super_Reader.data_samples_.Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0;
  local_190.super_Reader.data_samples_.Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start._1_7_ = 0;
  local_190.super_Reader.data_samples_.Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_190.super_Reader.data_samples_.Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  local_190.super_Reader.data_samples_.Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_190.super_Reader.data_samples_.Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  local_190.super_Reader.data_samples_.norm.super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
  local_190.super_Reader.data_samples_.norm.super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_start._1_7_ = 0;
  local_190.super_Reader.data_samples_.norm.super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_190.super_Reader.data_samples_.norm.super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_190.super_Reader.data_samples_.norm.super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_190.super_Reader.data_samples_._89_8_ = 0;
  local_190.super_Reader.shuffle_ = false;
  local_190.super_Reader.bin_out_ = true;
  local_190.super_Reader.splitor_._M_dataplus._M_p =
       (pointer)&local_190.super_Reader.splitor_.field_2;
  local_190.super_Reader.splitor_._M_string_length = 0;
  local_190.super_Reader.splitor_.field_2._M_local_buf[0] = '\0';
  local_190.super_Reader.block_size_ = 500;
  local_190.super_Reader.seed_ = 1;
  local_190.super_Reader._vptr_Reader = (_func_int **)&PTR__InmemReader_0015e258;
  local_190.data_buf_.pos = 0;
  local_190.data_buf_.hash_value_1 = 0;
  local_190.data_buf_.hash_value_2 = 0;
  local_190.data_buf_.row_length = 0;
  local_190.data_buf_.norm.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_190.data_buf_._89_8_ = 0;
  local_190.data_buf_.row.
  super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_190.data_buf_.row.
  super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_190.data_buf_.row.
  super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_190.data_buf_.row.
  super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_190.data_buf_.row.
  super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  local_190.data_buf_.Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0;
  local_190.data_buf_.Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start._1_7_ = 0;
  local_190.data_buf_.Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_190.data_buf_.Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  local_190.data_buf_.Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_190.data_buf_.Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  local_190.data_buf_.norm.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0;
  local_190.data_buf_.norm.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start._1_7_ = 0;
  local_190.data_buf_.norm.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_190.data_buf_.norm.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  local_190.order_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  local_190.order_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_190._324_8_ = 0;
  local_190.order_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  local_190.order_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  InmemReader::Initialize(&local_190,filename);
  do {
    iVar1 = (*local_190.super_Reader._vptr_Reader[4])(&local_190);
    if (iVar1 == 0) {
      (*local_190.super_Reader._vptr_Reader[5])(&local_190);
    }
    else {
      has_label = true;
      switch(task_id) {
      case 2:
        CheckCSV((DMatrix *)0x0,false);
        break;
      case 3:
        has_label = false;
      case 0:
        CheckLR((DMatrix *)0x0,has_label,false);
        break;
      case 4:
        has_label = false;
      case 1:
        CheckFFM((DMatrix *)0x0,has_label,false);
      }
      iVar2 = iVar2 + 1;
    }
  } while (iVar2 < 10);
  InmemReader::~InmemReader(&local_190);
  return;
}

Assistant:

void read_from_memory(const std::string& filename, int task_id) {
  InmemReader in_mem_reader;
  Reader* reader = nullptr;
  in_mem_reader.Initialize(filename);
  reader = &in_mem_reader;
  DMatrix* matrix = nullptr;
  for (int i = 0; i < iteration_num; ++i) {
    int record_num = reader->Samples(matrix);
    if (record_num == 0) {
      --i;
      reader->Reset();
      continue;
    }
    switch (task_id) {
      case 0:
        CheckLR(matrix, true, false);
        break;
      case 1:
        CheckFFM(matrix, true, false);
        break;
      case 2:
        CheckCSV(matrix, false);
        break;
      case 3:
        CheckLR(matrix, false, false);
        break;
      case 4:
        CheckFFM(matrix, false, false);
        break;
    }
  }
}